

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O2

void basisu::scale_image(imagef *src,imagef *dst,vec4F *scale,vec4F *shift)

{
  vec4F *pvVar1;
  float *pfVar2;
  uint32_t c;
  uint32_t i;
  uint32_t y;
  uint32_t x;
  uint x_00;
  float fVar3;
  float fVar4;
  float fVar5;
  vec4F d;
  
  d.m_v[0] = 0.0;
  d.m_v[1] = 0.0;
  d.m_v[2] = 0.0;
  d.m_v[3] = 1.0;
  imagef::resize(dst,src,0xffffffff,&d);
  for (y = 0; (int)y < (int)dst->m_height; y = y + 1) {
    for (x_00 = 0; x_00 < dst->m_width; x_00 = x_00 + 1) {
      pvVar1 = imagef::operator()(src,x_00,y);
      for (i = 0; i != 4; i = i + 1) {
        fVar3 = vec<4U,_float>::operator[](scale,i);
        fVar4 = vec<4U,_float>::operator[](pvVar1,i);
        fVar5 = vec<4U,_float>::operator[](shift,i);
        pfVar2 = vec<4U,_float>::operator[](&d,i);
        *pfVar2 = fVar5 + fVar4 * fVar3;
      }
      pvVar1 = imagef::operator()(dst,x_00,y);
      *(undefined8 *)pvVar1->m_v = d.m_v._0_8_;
      *(undefined8 *)(pvVar1->m_v + 2) = d.m_v._8_8_;
    }
  }
  return;
}

Assistant:

void scale_image(const imagef &src, imagef &dst, const vec4F &scale, const vec4F &shift)
	{
		dst.resize(src);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &p = src(x, y);

				vec4F d;

				for (uint32_t c = 0; c < 4; c++)
					d[c] = scale[c] * p[c] + shift[c];

				dst(x, y).set(d[0], d[1], d[2], d[3]);
			}
		}
	}